

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int read_attribute(dwarf_form form,uint64_t implicit_val,dwarf_buf *buf,int is_dwarf64,int version,
                  int addrsize,dwarf_sections *dwarf_sections,dwarf_data *altlink,attr_val *val)

{
  byte *pbVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uchar *puVar8;
  uchar *p;
  char *pcVar9;
  char local_118 [8];
  char b [200];
  attr_val *val_local;
  
  uVar6 = (ulong)form;
LAB_0012f865:
  *(undefined8 *)val = 0;
  (val->u).uint = 0;
  iVar3 = (int)uVar6;
  if (iVar3 < 0x1f01) {
    switch(iVar3) {
    case 1:
      val->encoding = ATTR_VAL_ADDRESS;
      goto LAB_0012fb11;
    default:
      goto switchD_0012f882_caseD_2;
    case 3:
      val->encoding = ATTR_VAL_BLOCK;
      uVar2 = read_uint16(buf);
      uVar7 = (uint64_t)uVar2;
      break;
    case 4:
      val->encoding = ATTR_VAL_BLOCK;
      uVar5 = read_uint32(buf);
      uVar7 = (uint64_t)uVar5;
      break;
    case 5:
      val->encoding = ATTR_VAL_UINT;
      goto LAB_0012fb2a;
    case 6:
      val->encoding = ATTR_VAL_UINT;
      goto LAB_0012fbaf;
    case 7:
      val->encoding = ATTR_VAL_UINT;
      goto LAB_0012fbef;
    case 8:
      val->encoding = ATTR_VAL_STRING;
      pcVar9 = read_string(buf);
      (val->u).string = pcVar9;
      return (uint)(pcVar9 != (char *)0x0);
    case 9:
      val->encoding = ATTR_VAL_BLOCK;
      goto LAB_0012fbc4;
    case 10:
      val->encoding = ATTR_VAL_BLOCK;
      pbVar1 = buf->buf;
      iVar3 = advance(buf,1);
      if (iVar3 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint64_t)*pbVar1;
      }
      break;
    case 0xb:
    case 0xc:
      val->encoding = ATTR_VAL_UINT;
      goto LAB_0012fb43;
    case 0xd:
      val->encoding = ATTR_VAL_SINT;
      uVar7 = read_sleb128(buf);
      goto LAB_0012fbfa;
    case 0xe:
      if (is_dwarf64 == 0) {
        uVar5 = read_uint32(buf);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = read_uint64(buf);
      }
      if (dwarf_sections->size[4] <= uVar6) {
        pcVar9 = "DW_FORM_strp out of range";
        goto LAB_0012fd79;
      }
      val->encoding = ATTR_VAL_STRING;
      puVar8 = dwarf_sections->data[4] + uVar6;
      goto LAB_0012fce1;
    case 0xf:
      val->encoding = ATTR_VAL_UINT;
      goto LAB_0012fa99;
    case 0x10:
      val->encoding = ATTR_VAL_REF_INFO;
      if (version != 2) goto LAB_0012fb93;
LAB_0012fb11:
      uVar7 = read_address(buf,addrsize);
      goto LAB_0012fbfa;
    case 0x11:
      val->encoding = ATTR_VAL_REF_UNIT;
LAB_0012fb43:
      pbVar1 = buf->buf;
      iVar3 = advance(buf,1);
      if (iVar3 == 0) {
        puVar8 = (uchar *)0x0;
      }
      else {
        puVar8 = (uchar *)(ulong)*pbVar1;
      }
      goto LAB_0012fce1;
    case 0x12:
      val->encoding = ATTR_VAL_REF_UNIT;
LAB_0012fb2a:
      uVar2 = read_uint16(buf);
      uVar7 = (uint64_t)uVar2;
      goto LAB_0012fbfa;
    case 0x13:
      val->encoding = ATTR_VAL_REF_UNIT;
      goto LAB_0012fbaf;
    case 0x14:
      val->encoding = ATTR_VAL_REF_UNIT;
      goto LAB_0012fbef;
    case 0x15:
      val->encoding = ATTR_VAL_REF_UNIT;
      goto LAB_0012fa99;
    case 0x16:
      uVar6 = read_uleb128(buf);
      if (uVar6 != 0x21) goto code_r0x0012f899;
      pcVar9 = "DW_FORM_indirect to DW_FORM_implicit_const";
      goto LAB_0012fd79;
    case 0x17:
      val->encoding = ATTR_VAL_REF_SECTION;
LAB_0012fb93:
      if (is_dwarf64 == 0) {
        uVar5 = read_uint32(buf);
        puVar8 = (uchar *)(ulong)uVar5;
      }
      else {
        puVar8 = (uchar *)read_uint64(buf);
      }
      goto LAB_0012fce1;
    case 0x18:
      val->encoding = ATTR_VAL_EXPR;
LAB_0012fbc4:
      uVar7 = read_uleb128(buf);
      break;
    case 0x19:
      val->encoding = ATTR_VAL_UINT;
      (val->u).uint = 1;
      return 1;
    case 0x1a:
      puVar8 = (uchar *)read_uleb128(buf);
      goto LAB_0012fccd;
    case 0x1b:
      puVar8 = (uchar *)read_uleb128(buf);
      goto LAB_0012fcdb;
    case 0x1c:
      val->encoding = ATTR_VAL_REF_SECTION;
LAB_0012fbaf:
      uVar5 = read_uint32(buf);
      uVar7 = (uint64_t)uVar5;
      goto LAB_0012fbfa;
    case 0x1d:
      goto switchD_0012f882_caseD_1d;
    case 0x1e:
      val->encoding = ATTR_VAL_BLOCK;
      uVar7 = 0x10;
      break;
    case 0x1f:
      if (is_dwarf64 == 0) {
        uVar5 = read_uint32(buf);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = read_uint64(buf);
      }
      if (uVar6 < dwarf_sections->size[7]) {
        val->encoding = ATTR_VAL_STRING;
        puVar8 = dwarf_sections->data[7] + uVar6;
        goto LAB_0012fce1;
      }
      pcVar9 = "DW_FORM_line_strp out of range";
      goto LAB_0012fd79;
    case 0x20:
      val->encoding = ATTR_VAL_REF_TYPE;
      goto LAB_0012fbef;
    case 0x21:
      val->encoding = ATTR_VAL_UINT;
      (val->u).uint = implicit_val;
      return 1;
    case 0x22:
      goto switchD_0012f882_caseD_22;
    case 0x23:
      val->encoding = ATTR_VAL_RNGLISTS_INDEX;
      goto LAB_0012fa99;
    case 0x24:
      val->encoding = ATTR_VAL_REF_SECTION;
LAB_0012fbef:
      uVar7 = read_uint64(buf);
      goto LAB_0012fbfa;
    case 0x25:
      pbVar1 = buf->buf;
      iVar3 = advance(buf,1);
      if (iVar3 == 0) {
        puVar8 = (uchar *)0x0;
      }
      else {
        puVar8 = (uchar *)(ulong)*pbVar1;
      }
      goto LAB_0012fccd;
    case 0x26:
      uVar2 = read_uint16(buf);
      puVar8 = (uchar *)(ulong)uVar2;
      goto LAB_0012fccd;
    case 0x27:
      uVar4 = read_uint24(buf);
      goto LAB_0012fa15;
    case 0x28:
      uVar4 = read_uint32(buf);
LAB_0012fa15:
      puVar8 = (uchar *)(ulong)uVar4;
LAB_0012fccd:
      val->encoding = ATTR_VAL_STRING_INDEX;
      goto LAB_0012fce1;
    case 0x29:
      pbVar1 = buf->buf;
      iVar3 = advance(buf,1);
      if (iVar3 == 0) {
        puVar8 = (uchar *)0x0;
      }
      else {
        puVar8 = (uchar *)(ulong)*pbVar1;
      }
      goto LAB_0012fcdb;
    case 0x2a:
      uVar2 = read_uint16(buf);
      puVar8 = (uchar *)(ulong)uVar2;
      goto LAB_0012fcdb;
    case 0x2b:
      uVar4 = read_uint24(buf);
      goto LAB_0012fc0b;
    case 0x2c:
      uVar4 = read_uint32(buf);
LAB_0012fc0b:
      puVar8 = (uchar *)(ulong)uVar4;
LAB_0012fcdb:
      val->encoding = ATTR_VAL_ADDRESS_INDEX;
      goto LAB_0012fce1;
    }
    iVar3 = advance(buf,uVar7);
    return iVar3;
  }
  if (iVar3 < 0x1f20) {
    if ((iVar3 != 0x1f01) && (iVar3 != 0x1f02)) {
switchD_0012f882_caseD_2:
      snprintf(local_118,200,"%s in %s at %d","unrecognized DWARF form",buf->name,
               (ulong)(uint)(*(int *)&buf->buf - *(int *)&buf->start));
      (*buf->error_callback)(buf->data,local_118,-1);
      return 0;
    }
switchD_0012f882_caseD_22:
    val->encoding = ATTR_VAL_REF_SECTION;
LAB_0012fa99:
    uVar7 = read_uleb128(buf);
LAB_0012fbfa:
    (val->u).uint = uVar7;
  }
  else {
    if (iVar3 == 0x1f20) {
      if (is_dwarf64 == 0) {
        uVar5 = read_uint32(buf);
        uVar7 = (uint64_t)uVar5;
      }
      else {
        uVar7 = read_uint64(buf);
      }
      (val->u).uint = uVar7;
      if (altlink != (dwarf_data *)0x0) {
        val->encoding = ATTR_VAL_REF_ALT_INFO;
        return 1;
      }
    }
    else {
      if (iVar3 != 0x1f21) goto switchD_0012f882_caseD_2;
switchD_0012f882_caseD_1d:
      if (is_dwarf64 == 0) {
        uVar5 = read_uint32(buf);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = read_uint64(buf);
      }
      if (altlink != (dwarf_data *)0x0) {
        if (uVar6 < (altlink->dwarf_sections).size[4]) {
          val->encoding = ATTR_VAL_STRING;
          puVar8 = (altlink->dwarf_sections).data[4] + uVar6;
LAB_0012fce1:
          (val->u).string = (char *)puVar8;
          return 1;
        }
        pcVar9 = "DW_FORM_strp_sup out of range";
LAB_0012fd79:
        dwarf_buf_error(buf,pcVar9,0);
        return 0;
      }
    }
    val->encoding = ATTR_VAL_NONE;
  }
  return 1;
code_r0x0012f899:
  implicit_val = 0;
  goto LAB_0012f865;
}

Assistant:

static int
read_attribute (enum dwarf_form form, uint64_t implicit_val,
		struct dwarf_buf *buf, int is_dwarf64, int version,
		int addrsize, const struct dwarf_sections *dwarf_sections,
		struct dwarf_data *altlink, struct attr_val *val)
{
  /* Avoid warnings about val.u.FIELD may be used uninitialized if
     this function is inlined.  The warnings aren't valid but can
     occur because the different fields are set and used
     conditionally.  */
  memset (val, 0, sizeof *val);

  switch (form)
    {
    case DW_FORM_addr:
      val->encoding = ATTR_VAL_ADDRESS;
      val->u.uint = read_address (buf, addrsize);
      return 1;
    case DW_FORM_block2:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint16 (buf));
    case DW_FORM_block4:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint32 (buf));
    case DW_FORM_data2:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_data4:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_data8:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_data16:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, 16);
    case DW_FORM_string:
      val->encoding = ATTR_VAL_STRING;
      val->u.string = read_string (buf);
      return val->u.string == NULL ? 0 : 1;
    case DW_FORM_block:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_block1:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_byte (buf));
    case DW_FORM_data1:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_flag:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_sdata:
      val->encoding = ATTR_VAL_SINT;
      val->u.sint = read_sleb128 (buf);
      return 1;
    case DW_FORM_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_STR] + offset;
	return 1;
      }
    case DW_FORM_line_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_LINE_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_line_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_LINE_STR] + offset;
	return 1;
      }
    case DW_FORM_udata:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_ref_addr:
      val->encoding = ATTR_VAL_REF_INFO;
      if (version == 2)
	val->u.uint = read_address (buf, addrsize);
      else
	val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_ref1:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_ref2:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_ref4:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref8:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_ref_udata:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_indirect:
      {
	uint64_t form;

	form = read_uleb128 (buf);
	if (form == DW_FORM_implicit_const)
	  {
	    dwarf_buf_error (buf,
			     "DW_FORM_indirect to DW_FORM_implicit_const",
			     0);
	    return 0;
	  }
	return read_attribute ((enum dwarf_form) form, 0, buf, is_dwarf64,
			       version, addrsize, dwarf_sections, altlink,
			       val);
      }
    case DW_FORM_sec_offset:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_exprloc:
      val->encoding = ATTR_VAL_EXPR;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_flag_present:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = 1;
      return 1;
    case DW_FORM_ref_sig8:
      val->encoding = ATTR_VAL_REF_TYPE;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_strx: case DW_FORM_strx1: case DW_FORM_strx2:
    case DW_FORM_strx3: case DW_FORM_strx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_strx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_strx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_strx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_strx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_strx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_addrx: case DW_FORM_addrx1: case DW_FORM_addrx2:
    case DW_FORM_addrx3: case DW_FORM_addrx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_addrx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_addrx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_addrx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_addrx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_addrx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_ADDRESS_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_ref_sup4:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref_sup8:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_implicit_const:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = implicit_val;
      return 1;
    case DW_FORM_loclistx:
      /* We don't distinguish this from DW_FORM_sec_offset.  It
       * shouldn't matter since we don't care about loclists.  */
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_rnglistx:
      val->encoding = ATTR_VAL_RNGLISTS_INDEX;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_addr_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_str_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_ref_alt:
      val->u.uint = read_offset (buf, is_dwarf64);
      if (altlink == NULL)
	{
	  val->encoding = ATTR_VAL_NONE;
	  return 1;
	}
      val->encoding = ATTR_VAL_REF_ALT_INFO;
      return 1;
    case DW_FORM_strp_sup: case DW_FORM_GNU_strp_alt:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (altlink == NULL)
	  {
	    val->encoding = ATTR_VAL_NONE;
	    return 1;
	  }
	if (offset >= altlink->dwarf_sections.size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp_sup out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) altlink->dwarf_sections.data[DEBUG_STR] + offset;
	return 1;
      }
    default:
      dwarf_buf_error (buf, "unrecognized DWARF form", -1);
      return 0;
    }
}